

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [32],char (*Args_1) [20],
          uint *Args_2,char (*Args_3) [57],uint *Args_4,char (*Args_5) [3])

{
  stringstream local_1c0 [8];
  stringstream ss;
  uint *Args_local_4;
  char (*Args_local_3) [57];
  uint *Args_local_2;
  char (*Args_local_1) [20];
  char (*Args_local) [32];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [32])this,(char (*) [20])Args,(uint *)Args_1,(char (*) [57])Args_2,
             (uint *)Args_3,(char (*) [3])Args_4);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}